

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool duckdb::DictionaryCompression::HasEnoughSpace
               (idx_t current_count,idx_t index_count,idx_t dict_size,
               bitpacking_width_t packing_width,idx_t block_size)

{
  idx_t iVar1;
  
  iVar1 = RequiredSpace(current_count,index_count,dict_size,packing_width);
  return iVar1 <= block_size;
}

Assistant:

bool DictionaryCompression::HasEnoughSpace(idx_t current_count, idx_t index_count, idx_t dict_size,
                                           bitpacking_width_t packing_width, const idx_t block_size) {
	return RequiredSpace(current_count, index_count, dict_size, packing_width) <= block_size;
}